

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O2

NodeRef __thiscall
embree::avx::BVHNBuilderVirtual<4>::BVHNBuilderT<embree::avx::CreateLeaf<4,_embree::QuadMi<4>_>_>::
createLeaf(BVHNBuilderT<embree::avx::CreateLeaf<4,_embree::QuadMi<4>_>_> *this,PrimRef *prims,
          range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  float fVar2;
  float fVar3;
  FastAllocator *this_00;
  ThreadLocal *pTVar4;
  ThreadLocal2 *this_01;
  Scene *pSVar5;
  Geometry *pGVar6;
  long lVar7;
  anon_union_16_2_9473010e_for_vuint_impl<4>_1 aVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  ulong uVar11;
  char *pcVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  PrimRef *pPVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  unsigned_long uVar20;
  undefined1 auVar21 [16];
  undefined1 in_ZMM0 [64];
  vuint<4> geomID;
  vuint<4> primID;
  vuint<4> v1;
  vuint<4> v0;
  undefined8 local_58;
  undefined8 uStack_50;
  vuint<4> v2;
  
  auVar21 = in_ZMM0._0_16_;
  uVar20 = set->_begin;
  uVar15 = (set->_end - uVar20) + 3 >> 2;
  v1.field_0.v[0] = uVar15 * 0x60;
  this_00 = alloc->alloc;
  pTVar4 = alloc->talloc1;
  this_01 = pTVar4->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    primID.field_0.v[1]._0_1_ = 1;
    primID.field_0.v[0] = (longlong)this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    geomID.field_0.v[1]._0_1_ = 1;
    geomID.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    auVar21 = (undefined1  [16])0x0;
    v0.field_0.v[0] = (longlong)this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,(value_type *)&v0);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&geomID);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&primID);
  }
  uVar9 = v1.field_0.v[0];
  pTVar4->bytesUsed = pTVar4->bytesUsed + v1.field_0.v[0];
  sVar13 = pTVar4->cur;
  uVar14 = (ulong)(-(int)sVar13 & 0xf);
  uVar11 = sVar13 + v1.field_0.v[0] + uVar14;
  pTVar4->cur = uVar11;
  if (pTVar4->end < uVar11) {
    pTVar4->cur = sVar13;
    uVar11 = pTVar4->allocBlockSize;
    if ((ulong)(v1.field_0.v[0] * 4) < uVar11 || v1.field_0.v[0] * 4 - uVar11 == 0) {
      geomID.field_0.v[0] = uVar11;
      pcVar12 = (char *)FastAllocator::malloc(this_00,(size_t)&geomID);
      pTVar4->ptr = pcVar12;
      sVar13 = (pTVar4->end - pTVar4->cur) + pTVar4->bytesWasted;
      pTVar4->bytesWasted = sVar13;
      pTVar4->end = geomID.field_0.v[0];
      pTVar4->cur = uVar9;
      if ((ulong)geomID.field_0.v[0] < (ulong)uVar9) {
        pTVar4->cur = 0;
        geomID.field_0.v[0] = pTVar4->allocBlockSize;
        pcVar12 = (char *)FastAllocator::malloc(this_00,(size_t)&geomID);
        pTVar4->ptr = pcVar12;
        sVar13 = (pTVar4->end - pTVar4->cur) + pTVar4->bytesWasted;
        pTVar4->bytesWasted = sVar13;
        pTVar4->end = geomID.field_0.v[0];
        pTVar4->cur = uVar9;
        if ((ulong)geomID.field_0.v[0] < (ulong)uVar9) {
          pTVar4->cur = 0;
          pcVar12 = (char *)0x0;
        }
        else {
          pTVar4->bytesWasted = sVar13;
        }
      }
      else {
        pTVar4->bytesWasted = sVar13;
      }
    }
    else {
      pcVar12 = (char *)FastAllocator::malloc(this_00,(size_t)&v1);
    }
  }
  else {
    pTVar4->bytesWasted = pTVar4->bytesWasted + uVar14;
    pcVar12 = pTVar4->ptr + (uVar11 - v1.field_0._0_8_);
  }
  uVar11 = 0;
  aVar8 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpcmpeqd_avx(auVar21,auVar21);
  for (; uVar11 != uVar15; uVar11 = uVar11 + 1) {
    uVar14 = set->_end;
    pSVar5 = ((this->createLeafFunc).bvh)->scene;
    pPVar16 = prims + uVar20;
    v0.field_0.v[0] = 0;
    v0.field_0.v[1] = 0;
    v1.field_0.v[0] = 0;
    v1.field_0.v[1] = 0;
    v2.field_0.v[0] = 0;
    v2.field_0.v[1] = 0;
    local_58 = 0;
    uStack_50 = 0;
    geomID.field_0 = aVar8;
    primID.field_0 = aVar8;
    for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 4) {
      if (uVar20 < uVar14) {
        fVar2 = (pPVar16->lower).field_0.m128[3];
        *(float *)((long)&geomID.field_0 + lVar17) = fVar2;
        fVar3 = (pPVar16->upper).field_0.m128[3];
        *(float *)((long)&primID.field_0 + lVar17) = fVar3;
        pGVar6 = (pSVar5->geometries).items[(uint)fVar2].ptr;
        lVar19 = (ulong)(uint)fVar3 *
                 pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
        lVar7 = *(long *)&pGVar6->field_0x58;
        uVar18 = *(uint *)&pGVar6[1].intersectionFilterN >> 2;
        *(uint *)((long)&v0.field_0 + lVar17) = *(int *)(lVar7 + lVar19) * uVar18;
        *(uint *)((long)&v1.field_0 + lVar17) = *(int *)(lVar7 + 4 + lVar19) * uVar18;
        *(uint *)((long)&v2.field_0 + lVar17) = *(int *)(lVar7 + 8 + lVar19) * uVar18;
        *(uint *)((long)&local_58 + lVar17) = uVar18 * *(int *)(lVar7 + 0xc + lVar19);
        uVar20 = uVar20 + 1;
      }
      else if (lVar17 != 0) {
        *(uint *)((long)&geomID.field_0 + lVar17) = geomID.field_0.i[0];
        *(undefined4 *)((long)&primID.field_0 + lVar17) = 0xffffffff;
        uVar10 = v0.field_0.i[0];
        *(uint *)((long)&v0.field_0 + lVar17) = v0.field_0.i[0];
        *(undefined4 *)((long)&v1.field_0 + lVar17) = uVar10;
        *(undefined4 *)((long)&v2.field_0 + lVar17) = uVar10;
        *(undefined4 *)((long)&local_58 + lVar17) = uVar10;
      }
      if (uVar20 < uVar14) {
        pPVar16 = prims + uVar20;
      }
    }
    lVar17 = uVar11 * 0x60;
    *(longlong *)(pcVar12 + lVar17) = v0.field_0.v[0];
    *(longlong *)((long)(pcVar12 + lVar17) + 8) = v0.field_0.v[1];
    *(longlong *)(pcVar12 + lVar17 + 0x10) = v1.field_0.v[0];
    *(longlong *)((long)(pcVar12 + lVar17 + 0x10) + 8) = v1.field_0.v[1];
    *(longlong *)(pcVar12 + lVar17 + 0x20) = v2.field_0.v[0];
    *(longlong *)((long)(pcVar12 + lVar17 + 0x20) + 8) = v2.field_0.v[1];
    *(undefined8 *)(pcVar12 + lVar17 + 0x30) = local_58;
    *(undefined8 *)(pcVar12 + lVar17 + 0x30 + 8) = uStack_50;
    *(longlong *)(pcVar12 + lVar17 + 0x40) = geomID.field_0.v[0];
    *(longlong *)((long)(pcVar12 + lVar17 + 0x40) + 8) = geomID.field_0.v[1];
    *(longlong *)(pcVar12 + lVar17 + 0x50) = primID.field_0.v[0];
    *(longlong *)((long)(pcVar12 + lVar17 + 0x50) + 8) = primID.field_0.v[1];
  }
  uVar11 = 7;
  if (uVar15 < 7) {
    uVar11 = uVar15;
  }
  return (NodeRef)(uVar11 | (ulong)pcVar12 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }